

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall
test_opt_step_adamw::build_graph(test_opt_step_adamw *this,ggml_context *ctx)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  ggml_tensor *pgVar6;
  
  uVar1 = ggml_new_tensor_4d(ctx,this->type,(this->ne)._M_elems[0],(this->ne)._M_elems[1],
                             (this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,uVar1);
  ggml_set_name(uVar1,"a");
  uVar2 = ggml_new_tensor_4d(ctx,this->type,(this->ne)._M_elems[0],(this->ne)._M_elems[1],
                             (this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar2,"grad");
  uVar3 = ggml_new_tensor_4d(ctx,this->type,(this->ne)._M_elems[0],(this->ne)._M_elems[1],
                             (this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar3,"grad_m");
  uVar4 = ggml_new_tensor_4d(ctx,this->type,(this->ne)._M_elems[0],(this->ne)._M_elems[1],
                             (this->ne)._M_elems[2],(this->ne)._M_elems[3]);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar4,"grad_v");
  uVar5 = ggml_new_tensor_1d(ctx,0,7);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_name(uVar5,"adamw_params");
  pgVar6 = (ggml_tensor *)ggml_opt_step_adamw(ctx,uVar1,uVar2,uVar3,uVar4,uVar5);
  ggml_set_name(pgVar6,"out");
  return pgVar6;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_param(ctx, a); // Despite tensor a having gradients the output tensor will not.
        ggml_set_name(a, "a");

        ggml_tensor * grad = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad, "grad");

        ggml_tensor * grad_m = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_m, "grad_m");

        ggml_tensor * grad_v = ggml_new_tensor_4d(ctx, type, ne[0], ne[1], ne[2], ne[3]);
        ggml_set_name(grad_v, "grad_v");

        ggml_tensor * adamw_params = ggml_new_tensor_1d(ctx, GGML_TYPE_F32, 7);
        ggml_set_name(adamw_params, "adamw_params");

        ggml_tensor * out = ggml_opt_step_adamw(ctx, a, grad, grad_m, grad_v, adamw_params);
        ggml_set_name(out, "out");

        return out;
    }